

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

string * __thiscall
pegmatite::InputRange::str_abi_cxx11_(string *__return_storage_ptr__,InputRange *this)

{
  bool bVar1;
  char32_t cVar2;
  iterator iVar3;
  char local_1dc;
  undefined1 auStack_1d8 [4];
  char32_t c;
  iterator __end1;
  undefined1 local_1b8 [8];
  iterator __begin1;
  InputRange *__range1;
  stringstream s;
  ostream local_190 [376];
  InputRange *local_18;
  InputRange *this_local;
  
  local_18 = this;
  this_local = (InputRange *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  __begin1.idx = (Index)this;
  iVar3 = begin(this);
  __begin1.buffer = (Input *)iVar3.idx;
  local_1b8 = (undefined1  [8])iVar3.buffer;
  iVar3 = end((InputRange *)__begin1.idx);
  while( true ) {
    __end1.buffer = (Input *)iVar3.idx;
    _auStack_1d8 = iVar3.buffer;
    bVar1 = Input::iterator::operator!=((iterator *)local_1b8,(iterator *)auStack_1d8);
    if (!bVar1) break;
    cVar2 = Input::iterator::operator*((iterator *)local_1b8);
    local_1dc = (char)cVar2;
    std::operator<<(local_190,local_1dc);
    Input::iterator::operator++((iterator *)local_1b8);
    iVar3.idx = (Index)__end1.buffer;
    iVar3.buffer = _auStack_1d8;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputRange::str() const
{
	std::stringstream s;

	for (char32_t c : *this)
	{
		s << static_cast<char>(c);
	}

	return s.str();
}